

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

char * Wlc_PrsFindRange(char *pStr,int *End,int *Beg)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  char *pcVar6;
  char cVar7;
  char *pcVar8;
  bool bVar9;
  
  *Beg = 0;
  *End = 0;
  do {
    pcVar6 = pStr;
    pStr = pcVar6 + 1;
  } while (*pcVar6 == ' ');
  pcVar8 = pcVar6 + 1;
  if (*pcVar6 != '[') {
    return pcVar6;
  }
  do {
    pcVar6 = pcVar8;
    pcVar8 = pcVar6 + 1;
  } while (*pcVar6 == ' ');
  if ((byte)(*pcVar6 - 0x3aU) < 0xf6) {
    return (char *)0x0;
  }
  iVar3 = atoi(pcVar6);
  *Beg = iVar3;
  *End = iVar3;
  cVar5 = *pcVar6;
  if (cVar5 == '\0') {
    return (char *)0x0;
  }
  bVar1 = true;
  cVar7 = cVar5;
  do {
    if (!(bool)(~bVar1 & 1U | cVar7 != ':')) {
      bVar1 = true;
      goto LAB_002ffdd2;
    }
    bVar9 = cVar7 != '\\';
    bVar2 = cVar7 == ' ';
    if (!bVar9) {
      bVar2 = bVar9;
    }
    if (bVar1) {
      bVar2 = bVar9;
    }
    bVar1 = bVar2;
    cVar7 = *pcVar8;
    pcVar8 = pcVar8 + 1;
  } while (cVar7 != '\0');
  bVar1 = true;
  while (!(bool)(bVar1 & cVar5 == ']')) {
    bVar9 = cVar5 != '\\';
    bVar2 = cVar5 == ' ';
    if (!bVar9) {
      bVar2 = bVar9;
    }
    if (bVar1) {
      bVar2 = bVar9;
    }
    bVar1 = bVar2;
    cVar5 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
    if (cVar5 == '\0') {
      return (char *)0x0;
    }
  }
  iVar4 = *Beg;
  goto LAB_002ffe65;
LAB_002ffdd2:
  do {
    if ((bool)(bVar1 & cVar5 == ':')) goto LAB_002ffe03;
    bVar9 = cVar5 != '\\';
    bVar2 = cVar5 == ' ';
    if (!bVar9) {
      bVar2 = bVar9;
    }
    if (bVar1) {
      bVar2 = bVar9;
    }
    bVar1 = bVar2;
    cVar5 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
  } while (cVar5 != '\0');
  pcVar6 = (char *)0x0;
LAB_002ffe03:
  do {
    pcVar8 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar8 == ' ');
  if ((byte)(*pcVar8 - 0x3aU) < 0xf6) {
    return (char *)0x0;
  }
  iVar4 = atoi(pcVar6);
  *Beg = iVar4;
  cVar5 = *pcVar6;
  if (cVar5 == '\0') {
    return (char *)0x0;
  }
  bVar1 = true;
  while (!(bool)(bVar1 & cVar5 == ']')) {
    bVar9 = cVar5 != '\\';
    bVar2 = cVar5 == ' ';
    if (!bVar9) {
      bVar2 = bVar9;
    }
    if (bVar1) {
      bVar2 = bVar9;
    }
    bVar1 = bVar2;
    cVar5 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
    if (cVar5 == '\0') {
      return (char *)0x0;
    }
  }
  iVar3 = *End;
LAB_002ffe65:
  if (iVar3 < iVar4) {
    return (char *)0x0;
  }
  return pcVar6 + 1;
}

Assistant:

static inline char * Wlc_PrsFindRange( char * pStr, int * End, int * Beg )
{
    *End = *Beg = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( pStr[0] != '[' )
        return pStr;
    pStr = Wlc_PrsSkipSpaces( pStr+1 );
    if ( !Wlc_PrsIsDigit(pStr) )
        return NULL;
    *End = *Beg = atoi( pStr );
    if ( Wlc_PrsFindSymbol( pStr, ':' ) == NULL )
    {
        pStr = Wlc_PrsFindSymbol( pStr, ']' );
        if ( pStr == NULL )
            return NULL;
    }
    else
    {
        pStr = Wlc_PrsFindSymbol( pStr, ':' );
        pStr = Wlc_PrsSkipSpaces( pStr+1 );
        if ( !Wlc_PrsIsDigit(pStr) )
            return NULL;
        *Beg = atoi( pStr );
        pStr = Wlc_PrsFindSymbol( pStr, ']' );
        if ( pStr == NULL )
            return NULL;
    }
    if ( *End < *Beg )
        return NULL;
    assert( *End >= *Beg );
    return pStr + 1;
}